

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O0

Array __thiscall notch::pre::SquareAugmented::unapply(SquareAugmented *this,Array *input)

{
  float *__first;
  float *pfVar1;
  float *__result;
  ulong uVar2;
  valarray<float> *in_RDX;
  float *extraout_RDX;
  Array AVar3;
  float local_30;
  undefined1 local_29;
  size_t local_28;
  size_t n;
  Array *input_local;
  SquareAugmented *this_local;
  Array *output;
  
  n = (size_t)in_RDX;
  input_local = input;
  this_local = this;
  local_28 = core::std::valarray<float>::size(in_RDX);
  local_29 = 0;
  local_30 = 0.0;
  core::std::valarray<float>::valarray((valarray<float> *)this,&local_30,local_28 >> 1);
  __first = core::std::begin<float>((valarray<float> *)n);
  pfVar1 = core::std::begin<float>((valarray<float> *)n);
  uVar2 = local_28 & 0xfffffffffffffffe;
  __result = core::std::begin<float>((valarray<float> *)this);
  std::copy<float_const*,float*>(__first,(float *)((long)pfVar1 + uVar2 * 2),__result);
  AVar3._M_data = extraout_RDX;
  AVar3._M_size = (size_t)this;
  return AVar3;
}

Assistant:

virtual Array unapply(const Array &input) {
        size_t n = input.size();
        Array output(0.0, n / 2);
        std::copy(std::begin(input),
                  std::begin(input) + (n/2),
                  std::begin(output));
        return output;
    }